

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomprops.c
# Opt level: O1

float getExplRad(int a)

{
  return (&AtomTblIndex[a]->eRad)[NuclearRadii != 0];
}

Assistant:

float getExplRad(int a)  {
  if (NuclearRadii) {
    /*if ( (strcmp(AtomTblIndex[a]->name, "H")    == 0) ||
         (strcmp(AtomTblIndex[a]->name, "Har")  == 0) ||
         (strcmp(AtomTblIndex[a]->name, "Hpol") == 0) ||
         (strcmp(AtomTblIndex[a]->name, "HOd")  == 0) ) {
      return ( (AtomTblIndex[a]->eRad - 0.05) );
    }*/
    return AtomTblIndex[a]->eRad_nuc;
  }
  else {
    return AtomTblIndex[a]->eRad;
  }
}